

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartThreading.cpp
# Opt level: O3

void testMultiPartThreading(string *tempDir)

{
  int count;
  ThreadPool *pTVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing the multi part APIs for multi-thread use",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  random_reseed(1);
  pTVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  count = IlmThread_2_5::ThreadPool::numThreads(pTVar1);
  pTVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(pTVar1,0x20);
  anon_unknown.dwarf_1ee9f1::testWriteRead(1,1,5,tempDir);
  anon_unknown.dwarf_1ee9f1::testWriteRead(2,2,10,tempDir);
  anon_unknown.dwarf_1ee9f1::testWriteRead(5,5,0x19,tempDir);
  anon_unknown.dwarf_1ee9f1::testWriteRead(0x32,2,0xfa,tempDir);
  pTVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(pTVar1,count);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  return;
}

Assistant:

void testMultiPartThreading (const std::string & tempDir)
{
    try
    {
        cout << "Testing the multi part APIs for multi-thread use" << endl;

        random_reseed(1);

        int numThreads = ThreadPool::globalThreadPool().numThreads();
        ThreadPool::globalThreadPool().setNumThreads(32);

        testWriteRead ( 1, 1,   5, tempDir);
        testWriteRead ( 2, 2,  10, tempDir);
        testWriteRead ( 5, 5,  25, tempDir);
        testWriteRead (50, 2, 250, tempDir);

        ThreadPool::globalThreadPool().setNumThreads(numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
        cerr << "ERROR -- caught exception: " << e.what() << endl;
        assert (false);
    }
}